

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Skeleton::drawGhost(Skeleton *this)

{
  int local_5c;
  undefined1 auStack_58 [4];
  int dummy;
  Vector3D meshScale;
  Vector3D meshRot;
  Vector3D meshPos;
  Skeleton *this_local;
  
  Vector3D::Vector3D((Vector3D *)&meshRot.z,&(this->mesh->super_SceneObject).position);
  Vector3D::Vector3D((Vector3D *)&meshScale.z,&(this->mesh->super_SceneObject).rotation);
  Vector3D::Vector3D((Vector3D *)auStack_58,&(this->mesh->super_SceneObject).scale);
  glPushMatrix();
  glTranslated(meshRot.z,meshPos.x,meshPos.y);
  glRotatef((float)meshScale.z,0x3f800000,0);
  glRotatef((float)meshRot.x,0,0x3f800000);
  glRotatef((float)meshRot.y,0,0,0x3f800000);
  glScalef((float)_auStack_58,(float)meshScale.x,(float)meshScale.y);
  drawJoint(this,this->root,&local_5c,false);
  drawCapsule(this,this->root);
  glPopMatrix();
  return;
}

Assistant:

void Skeleton::drawGhost()
  {
    Vector3D meshPos = mesh->position;
    Vector3D meshRot = mesh->rotation;
    Vector3D meshScale = mesh->scale;
    int dummy; // not used when pickMode is false, but required

    glPushMatrix();
      glTranslated(meshPos.x, meshPos.y, meshPos.z);
      glRotatef(meshRot.x, 1.0f, 0.0f, 0.0f);
      glRotatef(meshRot.y, 0.0f, 1.0f, 0.0f);
      glRotatef(meshRot.z, 0.0f, 0.0f, 1.0f);
      glScalef(meshScale.x, meshScale.y, meshScale.z);

      drawJoint(root,dummy);
      drawCapsule(root);

    glPopMatrix();
  }